

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvkfmt.c
# Opt level: O0

EVP_PKEY * evp_pkey_new0_key(void *key,int evp_type)

{
  int iVar1;
  int in_ESI;
  RSA *in_RDI;
  EVP_PKEY *pkey;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined3 in_stack_ffffffffffffffdc;
  int line;
  char *file;
  EVP_PKEY *local_8;
  
  file = (char *)0x0;
  if (in_RDI == (RSA *)0x0) {
    local_8 = (EVP_PKEY *)0x0;
  }
  else {
    line = CONCAT13(1,in_stack_ffffffffffffffdc);
    if (in_ESI != 6) {
      line = CONCAT13(in_ESI == 0x74,in_stack_ffffffffffffffdc);
    }
    if ((char)((uint)line >> 0x18) == '\0') {
      ERR_new();
      ERR_set_debug(file,line,(char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
      ;
      ERR_set_error(9,0xc0103,(char *)0x0);
      local_8 = (EVP_PKEY *)0x0;
    }
    else {
      local_8 = (EVP_PKEY *)EVP_PKEY_new();
      if (local_8 != (EVP_PKEY *)0x0) {
        if (in_ESI == 6) {
          iVar1 = EVP_PKEY_set1_RSA((EVP_PKEY *)local_8,in_RDI);
          if (iVar1 == 0) {
            EVP_PKEY_free((EVP_PKEY *)local_8);
            local_8 = (EVP_PKEY *)0x0;
          }
        }
        else if ((in_ESI == 0x74) &&
                (iVar1 = EVP_PKEY_set1_DSA((EVP_PKEY *)local_8,(dsa_st *)in_RDI), iVar1 == 0)) {
          EVP_PKEY_free((EVP_PKEY *)local_8);
          local_8 = (EVP_PKEY *)0x0;
        }
      }
      if (in_ESI == 6) {
        RSA_free(in_RDI);
      }
      else if (in_ESI == 0x74) {
        DSA_free((DSA *)in_RDI);
      }
      if (local_8 == (EVP_PKEY *)0x0) {
        ERR_new();
        ERR_set_debug((char *)local_8,line,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
        ERR_set_error(9,0xc0100,(char *)0x0);
      }
    }
  }
  return local_8;
}

Assistant:

static EVP_PKEY *evp_pkey_new0_key(void *key, int evp_type)
{
    EVP_PKEY *pkey = NULL;

    /*
     * It's assumed that if |key| is NULL, something went wrong elsewhere
     * and suitable errors are already reported.
     */
    if (key == NULL)
        return NULL;

    if (!ossl_assert(evp_type == EVP_PKEY_RSA || evp_type == EVP_PKEY_DSA)) {
        ERR_raise(ERR_LIB_PEM, ERR_R_INTERNAL_ERROR);
        return NULL;
    }

    if ((pkey = EVP_PKEY_new()) != NULL) {
        switch (evp_type) {
        case EVP_PKEY_RSA:
            if (EVP_PKEY_set1_RSA(pkey, key))
                break;
            EVP_PKEY_free(pkey);
            pkey = NULL;
            break;
#ifndef OPENSSL_NO_DSA
        case EVP_PKEY_DSA:
            if (EVP_PKEY_set1_DSA(pkey, key))
                break;
            EVP_PKEY_free(pkey);
            pkey = NULL;
            break;
#endif
        }
    }

    switch (evp_type) {
    case EVP_PKEY_RSA:
        RSA_free(key);
        break;
#ifndef OPENSSL_NO_DSA
    case EVP_PKEY_DSA:
        DSA_free(key);
        break;
#endif
    }

    if (pkey == NULL)
        ERR_raise(ERR_LIB_PEM, ERR_R_MALLOC_FAILURE);
    return pkey;
}